

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ecs_describe_ha_vips.cc
# Opt level: O3

int __thiscall
aliyun::Ecs::DescribeHaVips
          (Ecs *this,EcsDescribeHaVipsRequestType *req,EcsDescribeHaVipsResponseType *response,
          EcsErrorInfo *error_info)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  Int IVar4;
  ArrayIndex AVar5;
  char *pcVar6;
  AliRpcRequest *this_00;
  long *plVar7;
  size_t sVar8;
  Value *pVVar9;
  Value *pVVar10;
  size_type *psVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec_00;
  uint index;
  Value val;
  string secheme;
  string str_response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Reader reader;
  Value VStack_5f8;
  string local_5e0;
  EcsDescribeHaVipsResponseType *local_5c0;
  long *local_5b8;
  long local_5b0;
  long local_5a8 [2];
  string local_598;
  ValueHolder local_578;
  undefined8 uStack_570;
  long local_568 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_548;
  undefined8 local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_528;
  undefined8 local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_508;
  undefined8 local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4e8;
  undefined8 local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4c8;
  undefined8 local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4a8;
  undefined8 local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_488;
  undefined8 local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_468;
  undefined8 local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_448;
  undefined8 local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  Value *local_428;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  local_598._M_string_length = 0;
  local_598.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar6 = "https";
  }
  local_5b8 = local_5a8;
  local_5c0 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b8,pcVar6,pcVar6 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_5e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&VStack_5f8);
  local_578.string_ = (char *)local_568;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_578,local_5b8,local_5b0 + (long)local_5b8);
  std::__cxx11::string::append((char *)&local_578.int_);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_578.int_);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_420.field_2._M_allocated_capacity = *psVar11;
    local_420.field_2._8_8_ = plVar7[3];
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  }
  else {
    local_420.field_2._M_allocated_capacity = *psVar11;
    local_420._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_420._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_420);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if (local_578 != local_568) {
    operator_delete(local_578.string_,local_568[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar8 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar6,pcVar6 + sVar8);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&VStack_5f8,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"DescribeHaVips","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"OwnerId","");
    pcVar1 = (req->owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar1,pcVar1 + (req->owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResourceOwnerAccount","");
    pcVar1 = (req->resource_owner_account)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar1,pcVar1 + (req->resource_owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ResourceOwnerId","");
    pcVar1 = (req->resource_owner_id)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar1,pcVar1 + (req->resource_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->owner_account)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"OwnerAccount","");
    pcVar1 = (req->owner_account)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar1,pcVar1 + (req->owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_number)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"PageNumber","");
    pcVar1 = (req->page_number)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar1,pcVar1 + (req->page_number)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_size)._M_string_length != 0) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"PageSize","");
    pcVar1 = (req->page_size)._M_dataplus._M_p;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,pcVar1,pcVar1 + (req->page_size)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->filter)._M_string_length != 0) {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Filter","");
    pcVar1 = (req->filter)._M_dataplus._M_p;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e0,pcVar1,pcVar1 + (req->filter)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)&local_578.bool_);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar3 == 0) {
    iVar3 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_598);
    if (((0 < iVar3) && (local_598._M_string_length != 0)) &&
       (bVar2 = Json::Reader::parse(&local_140,&local_598,&VStack_5f8,true), bVar2)) {
      if (error_info != (EcsErrorInfo *)0x0 && iVar3 != 200) {
        bVar2 = Json::Value::isMember(&VStack_5f8,"RequestId");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&VStack_5f8,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)&local_578,pVVar9);
        }
        else {
          local_578.string_ = (char *)local_568;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_578,anon_var_dwarf_529825 + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_578.bool_);
        if (local_578 != local_568) {
          operator_delete(local_578.string_,local_568[0] + 1);
        }
        bVar2 = Json::Value::isMember(&VStack_5f8,"Code");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&VStack_5f8,"Code");
          Json::Value::asString_abi_cxx11_((string *)&local_578,pVVar9);
        }
        else {
          local_578.string_ = (char *)local_568;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_578,anon_var_dwarf_529825 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_578.bool_);
        if (local_578 != local_568) {
          operator_delete(local_578.string_,local_568[0] + 1);
        }
        bVar2 = Json::Value::isMember(&VStack_5f8,"HostId");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&VStack_5f8,"HostId");
          Json::Value::asString_abi_cxx11_((string *)&local_578,pVVar9);
        }
        else {
          local_578.string_ = (char *)local_568;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_578,anon_var_dwarf_529825 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_578.bool_);
        if (local_578 != local_568) {
          operator_delete(local_578.string_,local_568[0] + 1);
        }
        bVar2 = Json::Value::isMember(&VStack_5f8,"Message");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&VStack_5f8,"Message");
          Json::Value::asString_abi_cxx11_((string *)&local_578,pVVar9);
        }
        else {
          local_578.string_ = (char *)local_568;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_578,anon_var_dwarf_529825 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_578.bool_);
        if (local_578 != local_568) {
          operator_delete(local_578.string_,local_568[0] + 1);
        }
      }
      if (local_5c0 != (EcsDescribeHaVipsResponseType *)0x0 && iVar3 == 200) {
        bVar2 = Json::Value::isMember(&VStack_5f8,"TotalCount");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&VStack_5f8,"TotalCount");
          IVar4 = Json::Value::asInt(pVVar9);
          local_5c0->total_count = IVar4;
        }
        bVar2 = Json::Value::isMember(&VStack_5f8,"PageNumber");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&VStack_5f8,"PageNumber");
          IVar4 = Json::Value::asInt(pVVar9);
          local_5c0->page_number = IVar4;
        }
        bVar2 = Json::Value::isMember(&VStack_5f8,"PageSize");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&VStack_5f8,"PageSize");
          IVar4 = Json::Value::asInt(pVVar9);
          local_5c0->page_size = IVar4;
        }
        bVar2 = Json::Value::isMember(&VStack_5f8,"HaVips");
        iVar3 = 200;
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&VStack_5f8,"HaVips");
          bVar2 = Json::Value::isMember(pVVar9,"HaVip");
          if (bVar2) {
            pVVar9 = Json::Value::operator[](&VStack_5f8,"HaVips");
            pVVar9 = Json::Value::operator[](pVVar9,"HaVip");
            bVar2 = Json::Value::isArray(pVVar9);
            if ((bVar2) && (AVar5 = Json::Value::size(pVVar9), AVar5 != 0)) {
              index = 0;
              local_428 = pVVar9;
              do {
                local_568[2] = 0;
                local_568[3] = 0;
                local_568[0] = 0;
                local_568[1] = 0;
                local_578.int_ = 0;
                uStack_570 = 0;
                local_548 = &local_538;
                local_540 = 0;
                local_538._M_local_buf[0] = '\0';
                local_528 = &local_518;
                local_520 = 0;
                local_518._M_local_buf[0] = '\0';
                local_508 = &local_4f8;
                local_500 = 0;
                local_4f8._M_local_buf[0] = '\0';
                local_4e8 = &local_4d8;
                local_4e0 = 0;
                local_4d8._M_local_buf[0] = '\0';
                local_4c8 = &local_4b8;
                local_4c0 = 0;
                local_4b8._M_local_buf[0] = '\0';
                local_4a8 = &local_498;
                local_4a0 = 0;
                local_498._M_local_buf[0] = '\0';
                local_488 = &local_478;
                local_480 = 0;
                local_478._M_local_buf[0] = '\0';
                local_468 = &local_458;
                local_460 = 0;
                local_458._M_local_buf[0] = '\0';
                local_448 = &local_438;
                local_440 = 0;
                local_438._M_local_buf[0] = '\0';
                pVVar9 = Json::Value::operator[](pVVar9,index);
                bVar2 = Json::Value::isMember(pVVar9,"HaVipId");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"HaVipId");
                  Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_548,(string *)&local_5e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
                    operator_delete(local_5e0._M_dataplus._M_p,
                                    local_5e0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"RegionId");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"RegionId");
                  Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_528,(string *)&local_5e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
                    operator_delete(local_5e0._M_dataplus._M_p,
                                    local_5e0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"VpcId");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"VpcId");
                  Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_508,(string *)&local_5e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
                    operator_delete(local_5e0._M_dataplus._M_p,
                                    local_5e0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"VSwitchId");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"VSwitchId");
                  Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_4e8,(string *)&local_5e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
                    operator_delete(local_5e0._M_dataplus._M_p,
                                    local_5e0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"IpAddress");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"IpAddress");
                  Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_4c8,(string *)&local_5e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
                    operator_delete(local_5e0._M_dataplus._M_p,
                                    local_5e0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"Status");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"Status");
                  Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_4a8,(string *)&local_5e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
                    operator_delete(local_5e0._M_dataplus._M_p,
                                    local_5e0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"MasterInstanceId");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"MasterInstanceId");
                  Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_488,(string *)&local_5e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
                    operator_delete(local_5e0._M_dataplus._M_p,
                                    local_5e0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"Description");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"Description");
                  Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_468,(string *)&local_5e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
                    operator_delete(local_5e0._M_dataplus._M_p,
                                    local_5e0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"CreateTime");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"CreateTime");
                  Json::Value::asString_abi_cxx11_(&local_5e0,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_448,(string *)&local_5e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
                    operator_delete(local_5e0._M_dataplus._M_p,
                                    local_5e0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"AssociatedInstances");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"AssociatedInstances");
                  bVar2 = Json::Value::isMember(pVVar10,"associatedInstance");
                  if (bVar2) {
                    pVVar10 = Json::Value::operator[](pVVar9,"AssociatedInstances");
                    pVVar10 = Json::Value::operator[](pVVar10,"associatedInstance");
                    anon_unknown.dwarf_1b46a7::
                    Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::Json2Array((Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)pVVar10,(Value *)&local_578,vec);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"AssociatedEipAddresses");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"AssociatedEipAddresses");
                  bVar2 = Json::Value::isMember(pVVar10,"associatedEipAddresse");
                  if (bVar2) {
                    pVVar9 = Json::Value::operator[](pVVar9,"AssociatedEipAddresses");
                    pVVar9 = Json::Value::operator[](pVVar9,"associatedEipAddresse");
                    anon_unknown.dwarf_1b46a7::
                    Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::Json2Array((Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)pVVar9,(Value *)(local_568 + 1),vec_00);
                  }
                }
                std::
                vector<aliyun::EcsDescribeHaVipsHaVipType,_std::allocator<aliyun::EcsDescribeHaVipsHaVipType>_>
                ::push_back(&local_5c0->ha_vips,(value_type *)&local_578);
                EcsDescribeHaVipsHaVipType::~EcsDescribeHaVipsHaVipType
                          ((EcsDescribeHaVipsHaVipType *)&local_578);
                pVVar9 = local_428;
                AVar5 = Json::Value::size(local_428);
                index = index + 1;
              } while (index < AVar5);
            }
          }
        }
      }
      goto LAB_00162eff;
    }
    if (error_info == (EcsErrorInfo *)0x0) goto LAB_00162efa;
    pcVar6 = "parse response failed";
  }
  else {
    if (error_info == (EcsErrorInfo *)0x0) {
LAB_00162efa:
      iVar3 = -1;
      goto LAB_00162eff;
    }
    pcVar6 = "connect to host failed";
  }
  iVar3 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar6);
LAB_00162eff:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&VStack_5f8);
  if (local_5b8 != local_5a8) {
    operator_delete(local_5b8,local_5a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,
                    CONCAT71(local_598.field_2._M_allocated_capacity._1_7_,
                             local_598.field_2._M_local_buf[0]) + 1);
  }
  return iVar3;
}

Assistant:

int Ecs::DescribeHaVips(const EcsDescribeHaVipsRequestType& req,
                      EcsDescribeHaVipsResponseType* response,
                       EcsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeHaVips");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.filter.empty()) {
    req_rpc->AddRequestQuery("Filter", req.filter);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}